

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

Bond * __thiscall
OpenMD::MoleculeCreator::createBond
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,BondStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *atom1;
  Atom *atom2;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  BondType *bt;
  Bond *this_00;
  long *plVar5;
  uint base;
  long *plVar6;
  size_type *psVar7;
  string s;
  BondTypeParser btParser;
  string local_f8;
  string local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  vector<double,_std::allocator<double>_> local_98;
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
  local_60;
  
  BondTypeParser::BondTypeParser((BondTypeParser *)&local_60);
  ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  atom1 = ppAVar1[(uint)stamp->a];
  atom2 = ppAVar1[(uint)stamp->b];
  if (stamp->hasOverride_ == true) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    pcVar2 = (stamp->orType_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + (stamp->orType_)._M_string_length);
    std::vector<double,_std::allocator<double>_>::vector(&local_98,&stamp->orPars_);
    bt = BondTypeParser::parseTypeAndPars((BondTypeParser *)&local_60,&local_f8,&local_98);
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&local_f8,atom1);
    (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom2);
    bt = ForceField::getBondType(ff,&local_f8,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bt == (BondType *)0x0) {
      (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&local_f8,atom1);
      _Var3._M_p = local_f8._M_dataplus._M_p;
      (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom2);
      snprintf(painCave.errMsg,2000,"Can not find Matching Bond Type for[%s, %s]",_Var3._M_p,
               local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      simError();
      bt = (BondType *)0x0;
    }
  }
  this_00 = (Bond *)operator_new(0x98);
  Bond::Bond(this_00,atom1,atom2,bt);
  base = (uint)bt;
  iVar4 = IndexListContainer::pop(&localIndexMan->bondIndexContainer_);
  (this_00->super_ShortRangeInteraction).localIndex_ = iVar4;
  OpenMD_itoa_abi_cxx11_
            (&local_f8,
             (OpenMD *)
             ((ulong)((long)(mol->bonds_).
                            super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(mol->bonds_).
                           super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3),10,base);
  pcVar2 = (mol->molStamp_->Name).data_._M_dataplus._M_p;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar2,pcVar2 + (mol->molStamp_->Name).data_._M_string_length);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_80);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_a8 = *plVar6;
    lStack_a0 = plVar5[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar6;
    local_b8 = (long *)*plVar5;
  }
  local_b0 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_d8.field_2._M_allocated_capacity = *psVar7;
    local_d8.field_2._8_4_ = (undefined4)plVar5[3];
    local_d8.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar7;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
  ::~_Rb_tree(&local_60);
  return this_00;
}

Assistant:

Bond* MoleculeCreator::createBond(ForceField* ff, Molecule* mol,
                                    BondStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    BondTypeParser btParser;
    BondType* bondType = NULL;
    Atom* atomA;
    Atom* atomB;

    atomA = mol->getAtomAt(stamp->getA());
    atomB = mol->getAtomAt(stamp->getB());

    assert(atomA && atomB);

    if (stamp->hasOverride()) {
      try {
        bondType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                             stamp->getOverridePars());
      } catch (OpenMDException& e) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoleculeCreator Error: %s "
                 "for molecule %s\n",
                 e.what(), mol->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }

    } else {
      bondType = ff->getBondType(atomA->getType(), atomB->getType());

      if (bondType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Matching Bond Type for[%s, %s]",
                 atomA->getType().c_str(), atomB->getType().c_str());

        painCave.isFatal = 1;
        simError();
      }
    }

    Bond* bond = new Bond(atomA, atomB, bondType);

    // set the local index of this bond, the global index will be set later
    bond->setLocalIndex(localIndexMan->getNextBondIndex());

    // The rule for naming a bond is: MoleculeName_Bond_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Bond"
    // The third part is the index of the bond defined in meta-data file
    // For example, Butane_bond_0 is a valid Bond name in a butane molecule

    std::string s = OpenMD_itoa(mol->getNBonds(), 10);
    bond->setName(mol->getType() + "_Bond_" + s.c_str());
    return bond;
  }